

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char16_t>
::iterator::operator++(iterator *this)

{
  char32_t cVar1;
  char32_t *pcVar2;
  byte bVar3;
  char32_t cVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar3 = this->idx_ + 1;
  this->idx_ = bVar3;
  if (((this->next_chars_).size_ == (uint)bVar3) &&
     (pcVar2 = (this->first_)._M_current, pcVar2 != (this->last_)._M_current)) {
    (this->first_)._M_current = pcVar2 + 1;
    cVar1 = *pcVar2;
    cVar4 = L'\xffffffff';
    if ((cVar1 & 0x1ff800U) != 0xd800) {
      cVar4 = cVar1;
    }
    uVar6 = (ulong)(uint)cVar4;
    if (0x10ffff < (uint)cVar1) {
      uVar6 = 0xffffffff;
    }
    uVar5 = (uint)uVar6;
    if (uVar5 < 0x10000) {
      uVar7 = 0x100000000;
    }
    else {
      uVar7 = (ulong)((uVar5 & 0x3ff) << 0x10) | 0x2dc000000;
      uVar6 = (ulong)(uVar5 + 0xff0000 >> 10 | 0xd800);
    }
    this->next_chars_ = (encoded_chars<char16_t>)(uVar6 & 0xffff | uVar7);
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }